

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

uint32_t __thiscall
cppnet::Dispatcher::AddTimer
          (Dispatcher *this,user_timer_call_back *cb,void *param,uint32_t interval,bool always)

{
  uint32_t uVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::TimerEvent>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>_>
  *this_00;
  mapped_type *this_01;
  element_type *peVar5;
  Task local_b8;
  undefined1 local_98 [8];
  anon_class_40_5_2d89cefe task;
  weak_ptr<cppnet::TimerSlot> local_68;
  native_handle_type local_58;
  native_handle_type local_50;
  uint32_t local_48;
  uint32_t timer_id;
  undefined1 local_38 [8];
  shared_ptr<cppnet::TimerEvent> event;
  bool always_local;
  uint32_t interval_local;
  void *param_local;
  user_timer_call_back *cb_local;
  Dispatcher *this_local;
  
  event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       always;
  event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       interval;
  std::make_shared<cppnet::TimerEvent>();
  peVar3 = std::__shared_ptr_access<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_38);
  Event::AddType(&peVar3->super_Event,ET_USER_TIMER);
  peVar3 = std::__shared_ptr_access<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_38);
  TimerEvent::SetTimerCallBack(peVar3,cb,param);
  local_48 = MakeTimerID(this);
  local_50 = (native_handle_type)std::this_thread::get_id();
  local_58 = (this->_local_thread_id)._M_thread;
  bVar2 = std::operator==((id)local_50,(id)local_58);
  if (bVar2) {
    peVar4 = std::__shared_ptr_access<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_timer);
    std::weak_ptr<cppnet::TimerSlot>::weak_ptr<cppnet::TimerEvent,void>
              (&local_68,(shared_ptr<cppnet::TimerEvent> *)local_38);
    (**peVar4->_vptr_Timer)
              (peVar4,&local_68,
               (ulong)event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_,
               (ulong)(event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._3_1_ & 1));
    std::weak_ptr<cppnet::TimerSlot>::~weak_ptr(&local_68);
    this_00 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::TimerEvent>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>_>
               *)__all_timer_event_map();
    task.this = (Dispatcher *)(ulong)local_48;
    this_01 = std::
              unordered_map<unsigned_long,_std::shared_ptr<cppnet::TimerEvent>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>_>
              ::operator[](this_00,(key_type *)&task.this);
    std::shared_ptr<cppnet::TimerEvent>::operator=
              (this_01,(shared_ptr<cppnet::TimerEvent> *)local_38);
    peVar5 = std::
             __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_event_actions);
    (*peVar5->_vptr_EventActions[0xb])();
  }
  else {
    std::shared_ptr<cppnet::TimerEvent>::shared_ptr
              ((shared_ptr<cppnet::TimerEvent> *)local_98,(shared_ptr<cppnet::TimerEvent> *)local_38
              );
    task.event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = local_48;
    task.event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_;
    task.timer_id._0_1_ =
         event.super___shared_ptr<cppnet::TimerEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _3_1_ & 1;
    task._24_8_ = this;
    std::function<void()>::
    function<cppnet::Dispatcher::AddTimer(std::function<void(void*)>const&,void*,unsigned_int,bool)::__0&,void>
              ((function<void()> *)&local_b8,(anon_class_40_5_2d89cefe *)local_98);
    PostTask(this,&local_b8);
    std::function<void_()>::~function(&local_b8);
    AddTimer(std::function<void(void*)>const&,void*,unsigned_int,bool)::$_0::~__0((__0 *)local_98);
  }
  uVar1 = local_48;
  std::shared_ptr<cppnet::TimerEvent>::~shared_ptr((shared_ptr<cppnet::TimerEvent> *)local_38);
  return uVar1;
}

Assistant:

uint32_t Dispatcher::AddTimer(const user_timer_call_back& cb, void* param, uint32_t interval, bool always) {
    std::shared_ptr<TimerEvent> event = std::make_shared<TimerEvent>();
    event->AddType(ET_USER_TIMER);
    event->SetTimerCallBack(cb, param);

    uint32_t timer_id = MakeTimerID();

    if (std::this_thread::get_id() == _local_thread_id) {
        _timer->AddTimer(event, interval, always);
        __all_timer_event_map[timer_id] = event;
        _event_actions->Wakeup();
        
    } else {
        auto task = [event, timer_id, interval, always, this]() {
            _timer->AddTimer(event, interval, always);
            __all_timer_event_map[timer_id] = event;
        };
        PostTask(task);
    }
    return timer_id;
}